

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O2

Vec_Int_t * Abc_ManExpandCex(Gia_Man_t *pGia,Vec_Int_t *vCex)

{
  Gia_Obj_t *pGVar1;
  int Entry;
  Vec_Int_t *p;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int v;
  
  p = Vec_IntAlloc(vCex->nSize);
  for (iVar3 = 0; iVar3 < pGia->nRegs; iVar3 = iVar3 + 1) {
    pGVar2 = Gia_ManCi(pGia,(pGia->vCis->nSize - pGia->nRegs) + iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    Vec_IntPush(p,0);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  iVar3 = pGia->nRegs;
  v = 0;
LAB_00288792:
  do {
    if (v < pGia->vCis->nSize - pGia->nRegs) {
      pGVar2 = Gia_ManCi(pGia,v);
      if (pGVar2 != (Gia_Obj_t *)0x0) {
        pGVar1 = pGia->pObjs;
        if ((pGVar2 < pGVar1) || (pGVar1 + pGia->nObjs <= pGVar2)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (pGia->pRefs[(int)(((long)pGVar2 - (long)pGVar1) / 0xc)] == 0) {
          Entry = 0;
        }
        else {
          if (iVar3 == vCex->nSize) goto LAB_002887e3;
          Entry = Vec_IntEntry(vCex,iVar3);
          iVar3 = iVar3 + 1;
        }
        Vec_IntPush(p,Entry);
        v = v + 1;
        goto LAB_00288792;
      }
    }
LAB_002887e3:
    v = 0;
    if (iVar3 == vCex->nSize) {
      return p;
    }
  } while( true );
}

Assistant:

Vec_Int_t * Abc_ManExpandCex( Gia_Man_t * pGia, Vec_Int_t * vCex )
{
    Vec_Int_t * vCexNew;
    Gia_Obj_t * pObj;
    int i, k;

    // start with register outputs
    vCexNew = Vec_IntAlloc( Vec_IntSize(vCex) );
    Gia_ManForEachRo( pGia, pObj, i )
        Vec_IntPush( vCexNew, 0 );

    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    k = Gia_ManRegNum( pGia );
    while ( 1 )
    {
        Gia_ManForEachPi( pGia, pObj, i )
        {
            if ( Gia_ObjRefNum(pGia, pObj) == 0 )
                Vec_IntPush( vCexNew, 0 );
            else
            {
                if ( k == Vec_IntSize(vCex) )
                    break;
                Vec_IntPush( vCexNew, Vec_IntEntry(vCex, k++) );
            }
        }
        if ( k == Vec_IntSize(vCex) )
            break;
    }
    return vCexNew;
}